

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ThreadDescriptor::ThreadDescriptor
          (ThreadDescriptor *this,ThreadDescriptor *param_1)

{
  int64_t iVar1;
  int64_t iVar2;
  int32_t iVar3;
  ThreadDescriptor_ChromeThreadType TVar4;
  undefined4 uVar5;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ThreadDescriptor_00408528;
  iVar3 = param_1->tid_;
  this->pid_ = param_1->pid_;
  this->tid_ = iVar3;
  ::std::__cxx11::string::string((string *)&this->thread_name_,(string *)&param_1->thread_name_);
  this->legacy_sort_index_ = param_1->legacy_sort_index_;
  TVar4 = param_1->chrome_thread_type_;
  uVar5 = *(undefined4 *)&param_1->field_0x34;
  iVar1 = param_1->reference_timestamp_us_;
  iVar2 = param_1->reference_thread_instruction_count_;
  this->reference_thread_time_us_ = param_1->reference_thread_time_us_;
  this->reference_thread_instruction_count_ = iVar2;
  this->chrome_thread_type_ = TVar4;
  *(undefined4 *)&this->field_0x34 = uVar5;
  this->reference_timestamp_us_ = iVar1;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ThreadDescriptor::ThreadDescriptor(ThreadDescriptor&&) noexcept = default;